

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNodeSetDupNs(xmlNodePtr node,xmlNsPtr ns)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  _xmlNode *p_Var3;
  
  if ((ns != (xmlNsPtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
    if (node == (xmlNodePtr)0x0) {
      return (xmlNodePtr)ns;
    }
    if (node->type == XML_NAMESPACE_DECL) {
      return (xmlNodePtr)ns;
    }
    pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x30);
    if (pxVar1 != (xmlNodePtr)0x0) {
      pxVar1->_private = (void *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->last = (_xmlNode *)0x0;
      pxVar1->parent = (_xmlNode *)0x0;
      pxVar1->name = (xmlChar *)0x0;
      pxVar1->children = (_xmlNode *)0x0;
      pxVar1->type = XML_NAMESPACE_DECL;
      if (ns->href != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(ns->href);
        pxVar1->name = pxVar2;
        if (pxVar2 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar1);
          return (xmlNodePtr)0x0;
        }
      }
      if (ns->prefix != (xmlChar *)0x0) {
        p_Var3 = (_xmlNode *)xmlStrdup(ns->prefix);
        pxVar1->children = p_Var3;
        if (p_Var3 == (_xmlNode *)0x0) {
          (*xmlFree)(pxVar1->name);
          (*xmlFree)(pxVar1);
          return (xmlNodePtr)0x0;
        }
      }
      pxVar1->_private = node;
      return pxVar1;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXPathNodeSetDupNs(xmlNodePtr node, xmlNsPtr ns) {
    xmlNsPtr cur;

    if ((ns == NULL) || (ns->type != XML_NAMESPACE_DECL))
	return(NULL);
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
	return((xmlNodePtr) ns);

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_NAMESPACE_DECL;
    if (ns->href != NULL) {
	cur->href = xmlStrdup(ns->href);
        if (cur->href == NULL) {
            xmlFree(cur);
            return(NULL);
        }
    }
    if (ns->prefix != NULL) {
	cur->prefix = xmlStrdup(ns->prefix);
        if (cur->prefix == NULL) {
            xmlFree((xmlChar *) cur->href);
            xmlFree(cur);
            return(NULL);
        }
    }
    cur->next = (xmlNsPtr) node;
    return((xmlNodePtr) cur);
}